

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::PathTypeHandlerBase::DoShareTypeHandlerInternal<true>
          (PathTypeHandlerBase *this,ScriptContext *scriptContext)

{
  byte bVar1;
  TypePath *this_00;
  code *pcVar2;
  ushort uVar3;
  bool bVar4;
  undefined4 *puVar5;
  PropertyRecord *pPVar6;
  PropertyIndex index;
  uint index_00;
  
  if (((this->super_DynamicTypeHandler).flags & 0x1c) != 0xc) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xbf2,
                                "((GetFlags() & (IsLockedFlag | MayBecomeSharedFlag | IsSharedFlag)) == (IsLockedFlag | MayBecomeSharedFlag))"
                                ,
                                "(GetFlags() & (IsLockedFlag | MayBecomeSharedFlag | IsSharedFlag)) == (IsLockedFlag | MayBecomeSharedFlag)"
                               );
    if (!bVar4) goto LAB_00c52aa4;
    *puVar5 = 0;
  }
  if ((DAT_0145c365 == '\x01') &&
     (bVar1 = (this->super_DynamicTypeHandler).flags, (bVar1 & 0x20) != 0 && (bVar1 & 0x18) != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xbf3,
                                "(!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype())"
                                ,
                                "!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype()"
                               );
    if (!bVar4) goto LAB_00c52aa4;
    *puVar5 = 0;
  }
  if (DAT_0145c381 == '\x01') {
    this_00 = (this->typePath).ptr;
    uVar3 = (this->super_DynamicTypeHandler).unusedBytes >> 1;
    if (((this_00->data).ptr)->maxInitializedLength < uVar3) {
      TypePath::SetMaxInitializedLength(this_00,(uint)uVar3);
    }
    for (index_00 = 0; index_00 < (this->super_DynamicTypeHandler).unusedBytes >> 1;
        index_00 = index_00 + 1) {
      pPVar6 = TypePath::GetPropertyIdUnchecked((this->typePath).ptr,index_00);
      InvalidateFixedFieldAt(this,pPVar6->pid,(PropertyIndex)index_00,scriptContext);
    }
    bVar4 = HasOnlyInitializedNonFixedProperties(this);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xc06,"(HasOnlyInitializedNonFixedProperties())",
                                  "HasOnlyInitializedNonFixedProperties()");
      if (!bVar4) goto LAB_00c52aa4;
      *puVar5 = 0;
    }
    bVar4 = HasSingletonInstanceOnlyIfNeeded(this);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xc07,"(HasSingletonInstanceOnlyIfNeeded())",
                                  "HasSingletonInstanceOnlyIfNeeded()");
      if (!bVar4) {
LAB_00c52aa4:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    bVar4 = HasSingletonInstance(this);
    if (bVar4) {
      (((this->typePath).ptr)->singletonInstance).ptr =
           (RecyclerWeakReference<Js::DynamicObject> *)0x0;
    }
  }
  return;
}

Assistant:

void PathTypeHandlerBase::DoShareTypeHandlerInternal(ScriptContext* scriptContext)
    {
        Assert((GetFlags() & (IsLockedFlag | MayBecomeSharedFlag | IsSharedFlag)) == (IsLockedFlag | MayBecomeSharedFlag));
        Assert(!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype());

#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
        // If this handler is becoming shared we need to remove the singleton instance (so that it can be collected
        // if no longer referenced by anything else) and invalidate any fixed fields.
        if (FixPropsOnPathTypes())
        {
            if (invalidateFixedFields)
            {
                if (this->GetTypePath()->GetMaxInitializedLength() < GetPathLength())
                {
                    this->GetTypePath()->SetMaxInitializedLength(GetPathLength());
                }
                for (PropertyIndex index = 0; index < this->GetPathLength(); index++)
                {
                    InvalidateFixedFieldAt(this->GetTypePath()->GetPropertyIdUnchecked(index)->GetPropertyId(), index, scriptContext);
                }
            }

            Assert(HasOnlyInitializedNonFixedProperties());
            Assert(HasSingletonInstanceOnlyIfNeeded());
            if (HasSingletonInstance())
            {
                this->GetTypePath()->ClearSingletonInstance();
            }
        }
#endif
    }